

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O3

size_t rcnb_encode_blockend(wchar_t *code_out,rcnb_encodestate *state_in)

{
  ushort uVar1;
  byte bVar2;
  wchar_t *pwVar3;
  wchar_t *code_char;
  wchar_t *pwVar4;
  unsigned_short *puVar5;
  
  pwVar3 = code_out;
  if (state_in->cached == true) {
    bVar2 = state_in->trailing_byte;
    if ((char)bVar2 < '\0') {
      bVar2 = bVar2 & 0x7f;
      pwVar3 = L"bBƀƁƃƄƅßÞþ";
      pwVar4 = L"nNŃńŅņŇňƝƞÑǸǹȠȵ";
      puVar5 = &sb;
    }
    else {
      pwVar3 = L"cCĆćĈĉĊċČčƇƈÇȻȼ";
      pwVar4 = L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ";
      puVar5 = &sc;
    }
    uVar1 = *puVar5;
    *code_out = pwVar4[(ushort)(bVar2 / uVar1)];
    code_out[1] = pwVar3[(ushort)((ushort)bVar2 % uVar1)];
    pwVar3 = code_out + 2;
  }
  *pwVar3 = L'\0';
  state_in->cached = false;
  return (long)pwVar3 - (long)code_out >> 2;
}

Assistant:

size_t rcnb_encode_blockend(wchar_t* const code_out, rcnb_encodestate* state_in)
{
    wchar_t* code_char = code_out;
    if (state_in->cached) {
        rcnb_encode_byte(*(unsigned char*)(&state_in->trailing_byte), &code_char);
    }
    *code_char = 0;
    state_in->cached = false;
    return code_char - code_out;
}